

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O0

void __thiscall ipx::Basis::FreeBasicVariable(Basis *this,Int j)

{
  Int IVar1;
  BasicStatus BVar2;
  reference pvVar3;
  int in_ESI;
  Basis *in_RDI;
  Int m;
  Int in_stack_ffffffffffffffe4;
  
  IVar1 = Model::rows(in_RDI->model_);
  BVar2 = StatusOf(in_RDI,in_stack_ffffffffffffffe4);
  if (BVar2 != BASIC_FREE) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->map2basis_,(long)in_ESI);
    *pvVar3 = IVar1 + *pvVar3;
  }
  return;
}

Assistant:

void Basis::FreeBasicVariable(Int j) {
    const Int m = model_.rows();
    if (StatusOf(j) == BASIC_FREE)
        return;
    assert(StatusOf(j) == BASIC);
    assert(map2basis_[j] >= 0 && map2basis_[j] < m);
    map2basis_[j] += m;
}